

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-from-pseudo-trace-type.cpp
# Opt level: O2

unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
__thiscall
yactfr::internal::TraceTypeFromPseudoTraceTypeConverter::_dstFromPseudoDst
          (TraceTypeFromPseudoTraceTypeConverter *this,PseudoDst *pseudoDst)

{
  iterator iVar1;
  PseudoErt *in_RDX;
  __node_base *p_Var2;
  long *plVar3;
  undefined1 local_c8 [8];
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  TraceTypeFromPseudoTraceTypeConverter local_a8;
  EventRecordTypeSet ertSet;
  PseudoErtSet pseudoErts;
  
  pseudoErts._M_h._M_buckets = &pseudoErts._M_h._M_single_bucket;
  pseudoErts._M_h._M_bucket_count = 1;
  pseudoErts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pseudoErts._M_h._M_element_count = 0;
  pseudoErts._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pseudoErts._M_h._M_rehash_policy._M_next_resize = 0;
  pseudoErts._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ertSet._M_t._M_impl._0_8_ = in_RDX->_id;
  iVar1 = std::
          _Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>,_std::allocator<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>,_std::allocator<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(pseudoDst->_id + 0x128),(key_type *)&ertSet);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    plVar3 = (long *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>,_false>
                            ._M_cur + 0x20);
    while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
      ertSet._M_t._M_impl._0_8_ = plVar3 + 2;
      std::__detail::
      _Insert<yactfr::internal::PseudoErt_*,_yactfr::internal::PseudoErt_*,_std::allocator<yactfr::internal::PseudoErt_*>,_std::__detail::_Identity,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::hash<yactfr::internal::PseudoErt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<yactfr::internal::PseudoErt_*,_yactfr::internal::PseudoErt_*,_std::allocator<yactfr::internal::PseudoErt_*>,_std::__detail::_Identity,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::hash<yactfr::internal::PseudoErt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&pseudoErts,(value_type *)&ertSet);
    }
  }
  PseudoDst::validate((PseudoDst *)in_RDX,&pseudoErts);
  ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ertSet._M_t._M_impl.super__Rb_tree_header._M_header;
  ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ertSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &pseudoErts._M_h._M_before_begin;
  ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    _ertFromPseudoErt((TraceTypeFromPseudoTraceTypeConverter *)local_c8,(PseudoErt *)pseudoDst,
                      (PseudoDst *)p_Var2[1]._M_nxt);
    std::
    _Rb_tree<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,std::_Identity<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>,yactfr::internal::ErtIdComp,std::allocator<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>>
    ::
    _M_insert_unique<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>
              ((_Rb_tree<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,std::_Identity<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>,yactfr::internal::ErtIdComp,std::allocator<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>>
                *)&ertSet,
               (unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
                *)local_c8);
    std::
    unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>::
    ~unique_ptr((unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
                 *)local_c8);
  }
  local_c8 = (undefined1  [8])in_RDX->_id;
  _scopeStructTypeFromPseudoDt
            (&local_a8,(PseudoDt *)pseudoDst,(Scope)*(undefined8 *)&(in_RDX->_logLevel).super_type,
             (PseudoDst *)0x1,in_RDX);
  _scopeStructTypeFromPseudoDt
            ((TraceTypeFromPseudoTraceTypeConverter *)(local_b8 + 8),(PseudoDt *)pseudoDst,
             (Scope)(in_RDX->_logLevel).super_type.m_storage,(PseudoDst *)0x2,in_RDX);
  _scopeStructTypeFromPseudoDt
            ((TraceTypeFromPseudoTraceTypeConverter *)local_b8,(PseudoDt *)pseudoDst,
             (Scope)*(undefined8 *)&(in_RDX->_emfUri).super_type,(PseudoDst *)0x3,in_RDX);
  local_a8._pseudoTraceType =
       *(PseudoTraceType **)&(in_RDX->_emfUri).super_type.m_storage.dummy_.aligner_;
  tryCloneAttrs((MapItem *)local_c0);
  std::
  make_unique<yactfr::DataStreamType_const,unsigned_long_long,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,std::set<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,yactfr::internal::ErtIdComp,std::allocator<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>>,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,yactfr::ClockType_const*,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((unsigned_long_long *)this,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_c8,&in_RDX->_ns,&in_RDX->_name,
             (set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
              *)&in_RDX->_uid,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)&ertSet,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)&local_a8,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)(local_b8 + 8),(ClockType **)local_b8,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_a8._pseudoTraceType);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_c0);
  std::unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>::
  ~unique_ptr((unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
               *)local_b8);
  std::unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>::
  ~unique_ptr((unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
               *)(local_b8 + 8));
  std::unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>::
  ~unique_ptr((unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
               *)&local_a8);
  std::
  _Rb_tree<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_std::_Identity<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
  ::~_Rb_tree(&ertSet._M_t);
  std::
  _Hashtable<yactfr::internal::PseudoErt_*,_yactfr::internal::PseudoErt_*,_std::allocator<yactfr::internal::PseudoErt_*>,_std::__detail::_Identity,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::hash<yactfr::internal::PseudoErt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&pseudoErts._M_h);
  return (__uniq_ptr_data<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const DataStreamType> TraceTypeFromPseudoTraceTypeConverter::_dstFromPseudoDst(PseudoDst& pseudoDst)
{
    // collect pseudo child event record types
    PseudoErtSet pseudoErts;
    const auto it = _pseudoTraceType->pseudoOrphanErts().find(pseudoDst.id());

    if (it != _pseudoTraceType->pseudoOrphanErts().end()) {
        for (auto& ertIdPseudoOrphanErtPair : it->second) {
            pseudoErts.insert(&ertIdPseudoOrphanErtPair.second.pseudoErt());
        }
    }

    // validate pseudo data stream type before converting
    pseudoDst.validate(pseudoErts);

    // convert pseudo event record types
    EventRecordTypeSet ertSet;

    for (auto pseudoErt : pseudoErts) {
        ertSet.insert(this->_ertFromPseudoErt(*pseudoErt, pseudoDst));
    }

    // create yactfr data stream type
    return DataStreamType::create(pseudoDst.id(), pseudoDst.ns(), pseudoDst.name(),
                                  pseudoDst.uid(), std::move(ertSet),
                                  this->_scopeStructTypeFromPseudoDt(pseudoDst.pseudoPktCtxType(),
                                                                     Scope::PacketContext,
                                                                     &pseudoDst),
                                  this->_scopeStructTypeFromPseudoDt(pseudoDst.pseudoErHeaderType(),
                                                                     Scope::EventRecordHeader,
                                                                     &pseudoDst),
                                  this->_scopeStructTypeFromPseudoDt(pseudoDst.pseudoErCommonCtxType(),
                                                                     Scope::EventRecordCommonContext,
                                                                     &pseudoDst),
                                  pseudoDst.defClkType(), tryCloneAttrs(pseudoDst.attrs()));
}